

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# exception.cpp
# Opt level: O0

int main(int argc,char **argv)

{
  GLFWwindow *handle;
  char **argv_local;
  int argc_local;
  
  glfwInit();
  glfwWindowHint(0x20004,0);
  handle = glfwCreateWindow(0xfa,0xfa,*argv,(GLFWmonitor *)0x0,(GLFWwindow *)0x0);
  window = handle;
  if (handle == (GLFWwindow *)0x0) {
    argv_local._4_4_ = 0x7d;
  }
  else {
    glfwMakeContextCurrent(handle);
    init((EVP_PKEY_CTX *)handle);
    glfwDestroyWindow(window);
    glfwTerminate();
    argv_local._4_4_ = 0;
  }
  return argv_local._4_4_;
}

Assistant:

int main(int argc, char** argv)
{
#ifdef _WIN32
    SetErrorMode(SEM_FAILCRITICALERRORS | SEM_NOGPFAULTERRORBOX | SEM_NOOPENFILEERRORBOX);
#endif

    glfwInit();

    glfwWindowHint(GLFW_VISIBLE, GL_FALSE);

    window = glfwCreateWindow(250, 250, argv[0], NULL, NULL);
    if (!window) {
        return EXIT_SKIP;
    }

    glfwMakeContextCurrent(window);

    init();


    glfwDestroyWindow(window);
    glfwTerminate();

    return 0;
}